

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.h
# Opt level: O1

void __thiscall
wasm::BinaryenIRWriter<wasm::(anonymous_namespace)::Poppifier>::visitBlock
          (BinaryenIRWriter<wasm::(anonymous_namespace)::Poppifier> *this,Block *curr)

{
  pointer ppBVar1;
  Expression *pEVar2;
  Block *curr_00;
  Block *pBVar3;
  uint uVar4;
  pointer ppBStack_48;
  vector<wasm::Block_*,_std::allocator<wasm::Block_*>_> parents;
  Block *curr_local;
  
  parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)curr;
  if ((curr->name).super_IString.str._M_str == (char *)0x0) {
    uVar4 = 0;
    do {
      if ((curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
          usedElements <= (ulong)uVar4) {
        return;
      }
      pEVar2 = (curr->list).
               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
               [uVar4];
      visit(this,pEVar2);
      uVar4 = uVar4 + 1;
    } while ((pEVar2->type).id != 1);
  }
  else if (((curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
            usedElements == 0) ||
          ((*(curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
             .data)->_id != BlockId)) {
    emit(this,(Expression *)curr);
    ppBVar1 = parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    uVar4 = 0;
    do {
      if (ppBVar1[5] <= (Block *)(ulong)uVar4) break;
      pEVar2 = *(Expression **)
                (&(ppBVar1[4]->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.
                  _id + (long)(ulong)uVar4 * 2);
      visit(this,pEVar2);
      uVar4 = uVar4 + 1;
    } while ((pEVar2->type).id != 1);
    ppBVar1 = parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    emitScopeEnd(this,(Expression *)
                      parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (ppBVar1[1] == (Block *)0x1) {
      emitUnreachable(this);
      return;
    }
  }
  else {
    ppBStack_48 = (pointer)0x0;
    parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)curr;
    if ((curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
        usedElements != 0) {
      parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)curr;
      do {
        ppBVar1 = *(pointer *)
                   &(parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage[4]->
                    super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression;
        if (*(int *)ppBVar1 != 1) break;
        if (parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
            super__Vector_impl_data._M_start ==
            parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::Block*,std::allocator<wasm::Block*>>::
          _M_realloc_insert<wasm::Block*const&>
                    ((vector<wasm::Block*,std::allocator<wasm::Block*>> *)&ppBStack_48,
                     (iterator)
                     parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (Block **)
                     &parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else {
          *parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
           super__Vector_impl_data._M_start =
               (Block *)parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage;
          parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
          super__Vector_impl_data._M_start =
               parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        emit(this,(Expression *)
                  parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
        parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = ppBVar1;
      } while (ppBVar1[5] != (Block *)0x0);
    }
    emit(this,(Expression *)
              parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
    ppBVar1 = parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    uVar4 = 0;
    do {
      if (ppBVar1[5] <= (Block *)(ulong)uVar4) break;
      pEVar2 = *(Expression **)
                (&(ppBVar1[4]->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.
                  _id + (long)(ulong)uVar4 * 2);
      visit(this,pEVar2);
      uVar4 = uVar4 + 1;
    } while ((pEVar2->type).id != 1);
    ppBVar1 = parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    emitScopeEnd(this,(Expression *)
                      parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (ppBVar1[1] == (Block *)0x1) {
      emitUnreachable(this);
    }
    pBVar3 = (Block *)parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (ppBStack_48 !=
        parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      do {
        ppBVar1 = parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
                  super__Vector_impl_data._M_start + -1;
        curr_00 = parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
                  super__Vector_impl_data._M_start[-1];
        parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
        super__Vector_impl_data._M_start = ppBVar1;
        if ((pBVar3->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id !=
            1) {
          uVar4 = 1;
          do {
            if ((curr_00->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                usedElements <= (ulong)uVar4) break;
            pEVar2 = (curr_00->list).
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
                     [uVar4];
            visit(this,pEVar2);
            uVar4 = uVar4 + 1;
          } while ((pEVar2->type).id != 1);
        }
        emitScopeEnd(this,(Expression *)curr_00);
        if ((curr_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id ==
            1) {
          emitUnreachable(this);
        }
        pBVar3 = curr_00;
      } while (ppBStack_48 !=
               parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
               super__Vector_impl_data._M_start);
    }
    if (ppBStack_48 != (pointer)0x0) {
      operator_delete(ppBStack_48,
                      (long)parents.
                            super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppBStack_48);
    }
  }
  return;
}

Assistant:

void BinaryenIRWriter<SubType>::visitBlock(Block* curr) {
  auto visitChildren = [this](Block* curr, Index from) {
    auto& list = curr->list;
    while (from < list.size()) {
      auto* child = list[from];
      visit(child);
      if (child->type == Type::unreachable) {
        break;
      }
      ++from;
    }
  };

  // A block with no name never needs to be emitted: we can just emit its
  // contents. In some cases that will end up as "stacky" code, which is valid
  // in wasm but not in Binaryen IR. This is similar to what we do in
  // visitPossibleBlockContents(), and like there, when we reload such a binary
  // we'll end up creating a block for it then.
  //
  // Note that in visitPossibleBlockContents() we also optimize the case of a
  // block with a name but the name actually has no uses - that handles more
  // cases, but it requires more work. It is reasonable to do it in
  // visitPossibleBlockContents() which handles the common cases of blocks that
  // are children of control flow structures (like an if arm); doing it here
  // would affect every block, including highly-nested block stacks, which would
  // end up as quadratic time. In optimized code the name will not exist if it's
  // not used anyhow, so a minor optimization for the unoptimized case that
  // leads to potential quadratic behavior is not worth it here.
  if (!curr->name.is()) {
    visitChildren(curr, 0);
    return;
  }

  auto afterChildren = [this](Block* curr) {
    emitScopeEnd(curr);
    if (curr->type == Type::unreachable) {
      // Since this block is unreachable, no instructions will be emitted after
      // it in its enclosing scope. That means that this block will be the last
      // instruction before the end of its parent scope, so its type must match
      // the type of its parent. But we don't have a concrete type for this
      // block and we don't know what type its parent expects, so we can't
      // ensure the types match. To work around this, we insert an `unreachable`
      // instruction after every unreachable control flow structure and depend
      // on its polymorphic behavior to paper over any type mismatches.
      emitUnreachable();
    }
  };

  // Handle very deeply nested blocks in the first position efficiently,
  // avoiding heavy recursion. We only start to do this if we see it will help
  // us (to avoid allocation of the vector).
  if (!curr->list.empty() && curr->list[0]->is<Block>()) {
    std::vector<Block*> parents;
    Block* child;
    while (!curr->list.empty() && (child = curr->list[0]->dynCast<Block>())) {
      parents.push_back(curr);
      emit(curr);
      curr = child;
    }
    // Emit the current block, which does not have a block as a child in the
    // first position.
    emit(curr);
    visitChildren(curr, 0);
    afterChildren(curr);
    bool childUnreachable = curr->type == Type::unreachable;
    // Finish the later parts of all the parent blocks.
    while (!parents.empty()) {
      auto* parent = parents.back();
      parents.pop_back();
      if (!childUnreachable) {
        visitChildren(parent, 1);
      }
      afterChildren(parent);
      childUnreachable = parent->type == Type::unreachable;
    }
    return;
  }
  // Simple case of not having a nested block in the first position.
  emit(curr);
  visitChildren(curr, 0);
  afterChildren(curr);
}